

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LiteralComparators.hpp
# Opt level: O1

Comparison __thiscall
Kernel::LiteralComparators::Negative::compare(Negative *this,Literal *l1,Literal *l2)

{
  LiteralSelector *pLVar1;
  Comparison CVar2;
  uint uVar3;
  bool bVar4;
  bool bVar5;
  
  pLVar1 = (this->super_LiteralComparator)._selector;
  uVar3 = (uint)(l1->super_Term)._args[0]._content;
  if ((l1->super_Term)._functor == 0) {
    bVar4 = SUB41((uVar3 & 4) >> 2,0);
  }
  else {
    bVar4 = pLVar1->_reversePolarity != ((uVar3 >> 2 & 1) != 0);
  }
  uVar3 = (uint)(l2->super_Term)._args[0]._content;
  if ((l2->super_Term)._functor == 0) {
    bVar5 = SUB41((uVar3 & 4) >> 2,0);
  }
  else {
    bVar5 = pLVar1->_reversePolarity != ((uVar3 >> 2 & 1) != 0);
  }
  CVar2 = GREATER;
  if (bVar5 == false) {
    CVar2 = -(uint)(byte)(~bVar5 & bVar4);
  }
  if (bVar4 != false) {
    CVar2 = -(uint)(byte)(~bVar5 & bVar4);
  }
  return CVar2;
}

Assistant:

Comparison compare(Literal* l1, Literal* l2)
  {
    ASS(_selector);

    bool l1N=_selector->isNegativeForSelection(l1);
    bool l2N=_selector->isNegativeForSelection(l2);
    if( l1N && !l2N ) {
      return GREATER;
    } else if( !l1N && l2N ) {
      return LESS;
    } else {
      return EQUAL;
    }
  }